

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnType
          (BinaryReaderIR *this,Index index,Index param_count,Type *param_types,Index result_count,
          Type *result_types)

{
  Module *this_00;
  pointer pFVar1;
  unique_ptr<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>_>
  local_80 [3];
  FuncType *local_68;
  FuncType *func_type;
  unique_ptr<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>_> local_40;
  unique_ptr<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>_> field;
  Type *result_types_local;
  Index result_count_local;
  Type *param_types_local;
  Index param_count_local;
  Index index_local;
  BinaryReaderIR *this_local;
  
  field._M_t.
  super___uniq_ptr_impl<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>_>.
  _M_t.
  super__Tuple_impl<0UL,_wabt::FuncTypeModuleField_*,_std::default_delete<wabt::FuncTypeModuleField>_>
  .super__Head_base<0UL,_wabt::FuncTypeModuleField_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>,_true,_true>
        )(__uniq_ptr_data<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>,_true,_true>
          )result_types;
  GetLocation((Location *)&func_type,this);
  MakeUnique<wabt::FuncTypeModuleField,wabt::Location>((wabt *)&local_40,(Location *)&func_type);
  pFVar1 = std::
           unique_ptr<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>_>::
           operator->(&local_40);
  local_68 = &pFVar1->func_type;
  std::vector<wabt::Type,std::allocator<wabt::Type>>::assign<wabt::Type*,void>
            ((vector<wabt::Type,std::allocator<wabt::Type>> *)&(pFVar1->func_type).sig,param_types,
             param_types + param_count);
  std::vector<wabt::Type,std::allocator<wabt::Type>>::assign<wabt::Type*,void>
            ((vector<wabt::Type,std::allocator<wabt::Type>> *)&(local_68->sig).result_types,
             (Type *)field._M_t.
                     super___uniq_ptr_impl<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wabt::FuncTypeModuleField_*,_std::default_delete<wabt::FuncTypeModuleField>_>
                     .super__Head_base<0UL,_wabt::FuncTypeModuleField_*,_false>._M_head_impl,
             (Type *)((long)field._M_t.
                            super___uniq_ptr_impl<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wabt::FuncTypeModuleField_*,_std::default_delete<wabt::FuncTypeModuleField>_>
                            .super__Head_base<0UL,_wabt::FuncTypeModuleField_*,_false>._M_head_impl
                     + (ulong)result_count * 4));
  this_00 = this->module_;
  std::unique_ptr<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>_>::
  unique_ptr(local_80,&local_40);
  Module::AppendField(this_00,local_80);
  std::unique_ptr<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>_>::
  ~unique_ptr(local_80);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  std::unique_ptr<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>_>::
  ~unique_ptr(&local_40);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderIR::OnType(Index index,
                              Index param_count,
                              Type* param_types,
                              Index result_count,
                              Type* result_types) {
  auto field = MakeUnique<FuncTypeModuleField>(GetLocation());
  FuncType& func_type = field->func_type;
  func_type.sig.param_types.assign(param_types, param_types + param_count);
  func_type.sig.result_types.assign(result_types, result_types + result_count);
  module_->AppendField(std::move(field));
  return Result::Ok;
}